

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstrie.cpp
# Opt level: O2

UStringTrieResult __thiscall
icu_63::UCharsTrie::next(UCharsTrie *this,ConstChar16Ptr *ptr,int32_t sLength)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  UStringTrieResult UVar4;
  int iVar5;
  int iVar6;
  char16_t *pcVar7;
  UChar *pos;
  char16_t cVar8;
  uint length;
  long lVar9;
  int iVar10;
  char16_t *pcVar11;
  char16_t *pcVar12;
  
  pcVar12 = ptr->p_;
  if (sLength < 0) {
    if (*pcVar12 == L'\0') goto LAB_0029b0de;
  }
  else if (sLength == 0) {
LAB_0029b0de:
    UVar4 = current(this);
    return UVar4;
  }
  pcVar7 = this->pos_;
  if (pcVar7 == (char16_t *)0x0) {
    return USTRINGTRIE_NO_MATCH;
  }
  iVar6 = this->remainingMatchLength_;
LAB_0029afc4:
  iVar2 = -1;
  if (iVar6 < -1) {
    iVar2 = iVar6;
  }
  pcVar11 = pcVar12;
  if (sLength < 0) {
    do {
      pcVar12 = pcVar11 + 1;
      cVar8 = *pcVar11;
      if (cVar8 == L'\0') {
        this->remainingMatchLength_ = iVar6;
        this->pos_ = pcVar7;
        if (-1 < iVar6) {
          return USTRINGTRIE_NO_VALUE;
        }
        cVar8 = *pcVar7;
LAB_0029b127:
        if (0x3f < (ushort)cVar8) {
          return (ushort)cVar8 >> 0xf ^ USTRINGTRIE_INTERMEDIATE_VALUE;
        }
        return USTRINGTRIE_NO_VALUE;
      }
      if (iVar6 < 0) goto LAB_0029b03a;
      if (cVar8 != *pcVar7) goto LAB_0029b0ee;
      pcVar7 = pcVar7 + 1;
      iVar6 = iVar6 + -1;
      pcVar11 = pcVar12;
    } while( true );
  }
  iVar5 = -sLength;
  lVar9 = 0;
  iVar10 = iVar6;
  while( true ) {
    iVar5 = iVar5 + 1;
    if (iVar5 == 1) {
      this->remainingMatchLength_ = iVar6 - sLength;
      this->pos_ = pcVar7 + (uint)sLength;
      if (-1 < iVar6 - sLength) {
        return USTRINGTRIE_NO_VALUE;
      }
      cVar8 = pcVar7[(uint)sLength];
      goto LAB_0029b127;
    }
    cVar8 = *(char16_t *)((long)pcVar12 + lVar9);
    if (iVar10 < 0) break;
    if (cVar8 != *(char16_t *)((long)pcVar7 + lVar9)) goto LAB_0029b0ee;
    iVar10 = iVar10 + -1;
    lVar9 = lVar9 + 2;
  }
  pcVar7 = (char16_t *)((long)pcVar7 + lVar9);
  pcVar12 = (char16_t *)((long)pcVar12 + lVar9 + 2);
  sLength = -iVar5;
LAB_0029b03a:
  this->remainingMatchLength_ = iVar2;
  while( true ) {
    pos = pcVar7 + 1;
    uVar3 = (ushort)*pcVar7 & 0x3f;
    uVar1 = (uint)(ushort)*pcVar7;
    while (length = uVar1, 0x2f < length) {
      if (length < 0x40) {
        if (cVar8 != *pos) goto LAB_0029b0ee;
        pcVar7 = pos + 1;
        iVar6 = length - 0x31;
        goto LAB_0029afc4;
      }
      if (0x7fff < length) goto LAB_0029b0ee;
      uVar1 = uVar3;
      if (0x403f < length) {
        if (length < 0x7fc0) {
          pos = pos + 1;
        }
        else {
          pos = pos + 2;
        }
      }
    }
    UVar4 = branchNext(this,pos,length,(uint)(ushort)cVar8);
    if (UVar4 == USTRINGTRIE_NO_MATCH) {
      return USTRINGTRIE_NO_MATCH;
    }
    if (sLength < 0) {
      cVar8 = *pcVar12;
      if (cVar8 == L'\0') {
        return UVar4;
      }
    }
    else {
      if (sLength == 0) {
        return UVar4;
      }
      cVar8 = *pcVar12;
      sLength = sLength - 1;
    }
    if (UVar4 == USTRINGTRIE_FINAL_VALUE) break;
    pcVar12 = pcVar12 + 1;
    pcVar7 = this->pos_;
  }
LAB_0029b0ee:
  this->pos_ = (char16_t *)0x0;
  return USTRINGTRIE_NO_MATCH;
}

Assistant:

UStringTrieResult
UCharsTrie::next(ConstChar16Ptr ptr, int32_t sLength) {
    const UChar *s=ptr;
    if(sLength<0 ? *s==0 : sLength==0) {
        // Empty input.
        return current();
    }
    const UChar *pos=pos_;
    if(pos==NULL) {
        return USTRINGTRIE_NO_MATCH;
    }
    int32_t length=remainingMatchLength_;  // Actual remaining match length minus 1.
    for(;;) {
        // Fetch the next input unit, if there is one.
        // Continue a linear-match node without rechecking sLength<0.
        int32_t uchar;
        if(sLength<0) {
            for(;;) {
                if((uchar=*s++)==0) {
                    remainingMatchLength_=length;
                    pos_=pos;
                    int32_t node;
                    return (length<0 && (node=*pos)>=kMinValueLead) ?
                            valueResult(node) : USTRINGTRIE_NO_VALUE;
                }
                if(length<0) {
                    remainingMatchLength_=length;
                    break;
                }
                if(uchar!=*pos) {
                    stop();
                    return USTRINGTRIE_NO_MATCH;
                }
                ++pos;
                --length;
            }
        } else {
            for(;;) {
                if(sLength==0) {
                    remainingMatchLength_=length;
                    pos_=pos;
                    int32_t node;
                    return (length<0 && (node=*pos)>=kMinValueLead) ?
                            valueResult(node) : USTRINGTRIE_NO_VALUE;
                }
                uchar=*s++;
                --sLength;
                if(length<0) {
                    remainingMatchLength_=length;
                    break;
                }
                if(uchar!=*pos) {
                    stop();
                    return USTRINGTRIE_NO_MATCH;
                }
                ++pos;
                --length;
            }
        }
        int32_t node=*pos++;
        for(;;) {
            if(node<kMinLinearMatch) {
                UStringTrieResult result=branchNext(pos, node, uchar);
                if(result==USTRINGTRIE_NO_MATCH) {
                    return USTRINGTRIE_NO_MATCH;
                }
                // Fetch the next input unit, if there is one.
                if(sLength<0) {
                    if((uchar=*s++)==0) {
                        return result;
                    }
                } else {
                    if(sLength==0) {
                        return result;
                    }
                    uchar=*s++;
                    --sLength;
                }
                if(result==USTRINGTRIE_FINAL_VALUE) {
                    // No further matching units.
                    stop();
                    return USTRINGTRIE_NO_MATCH;
                }
                pos=pos_;  // branchNext() advanced pos and wrote it to pos_ .
                node=*pos++;
            } else if(node<kMinValueLead) {
                // Match length+1 units.
                length=node-kMinLinearMatch;  // Actual match length minus 1.
                if(uchar!=*pos) {
                    stop();
                    return USTRINGTRIE_NO_MATCH;
                }
                ++pos;
                --length;
                break;
            } else if(node&kValueIsFinal) {
                // No further matching units.
                stop();
                return USTRINGTRIE_NO_MATCH;
            } else {
                // Skip intermediate value.
                pos=skipNodeValue(pos, node);
                node&=kNodeTypeMask;
            }
        }
    }
}